

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomWalkUtils.h
# Opt level: O3

OrderedEdgeCollection *
GetEdgesByRandomWalk
          (OrderedEdgeCollection *__return_storage_ptr__,size_type *cg,long params,
          undefined4 param_4)

{
  size_type sVar1;
  ulong uVar2;
  result_type rVar3;
  unsigned_long uVar4;
  ulong uVar5;
  long lVar6;
  VertexIdx VVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  unsigned_long uVar11;
  vector<OrderedEdge,_std::allocator<OrderedEdge>_> edge_list;
  uniform_int_distribution<long> dist_parent_nbor;
  vector<OrderedEdge,_std::allocator<OrderedEdge>_> local_1468;
  long local_1450;
  undefined4 local_1444;
  uniform_int_distribution<long> local_1440;
  vector<bool,_std::allocator<bool>_> local_1430;
  VertexIdx local_1408;
  OrderedEdgeCollection *local_1400;
  long local_13f8;
  long local_13f0;
  long local_13e8;
  vector<bool,_std::allocator<bool>_> local_13e0;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  sVar1 = *cg;
  lVar8 = *(long *)(params + 0x20);
  local_1450 = *(long *)(params + 0x40);
  local_1468.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1468.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
  super__Vector_impl_data._M_finish = (OrderedEdge *)0x0;
  local_1468.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (OrderedEdge *)0x0;
  local_13b8._M_x[0] = local_13b8._M_x[0] & 0xffffffffffffff00;
  local_1444 = param_4;
  local_13f0 = params;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_13e0,cg[1],(bool *)&local_13b8,(allocator_type *)&local_1430);
  local_13b8._M_x[0] = local_13b8._M_x[0] & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_1430,sVar1,(bool *)&local_13b8,(allocator_type *)&local_1440);
  if (lVar8 < 1) {
    VVar7 = 0;
  }
  else {
    local_1408 = 0;
    if (0 < local_1450) {
      local_1408 = local_1450;
    }
    local_1408 = local_1408 * lVar8;
    lVar6 = 0;
    local_1400 = __return_storage_ptr__;
    local_13f8 = lVar8;
    do {
      uVar2 = *(ulong *)(*(long *)(local_13f0 + 0x28) + lVar6 * 8);
      local_13e8 = lVar6;
      if (*(long *)(cg[2] + 8 + uVar2 * 8) == *(long *)(cg[2] + uVar2 * 8)) {
        memcpy(&local_13b8,
               &edge_list.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                super__Vector_impl_data._M_finish,5000);
        local_1440._M_param._M_b = *cg - 1;
        local_1440._M_param._M_a = 0;
        uVar9 = 0;
        do {
          printf("BAd luck! Trying again %d\n",uVar9);
          uVar2 = std::uniform_int_distribution<long>::operator()
                            (&local_1440,&local_13b8,&local_1440._M_param);
          if (0x3e6 < (uint)uVar9) break;
          uVar9 = (ulong)((uint)uVar9 + 1);
        } while (*(long *)(cg[2] + 8 + uVar2 * 8) == *(long *)(cg[2] + uVar2 * 8));
      }
      lVar8 = local_1450;
      if (0 < local_1450) {
        do {
          sVar1 = cg[2];
          uVar11 = *(long *)(sVar1 + 8 + uVar2 * 8) - *(long *)(sVar1 + uVar2 * 8);
          local_1440._M_param._M_b = uVar11 - 1;
          local_1440._M_param._M_a = 0;
          lVar6 = *(long *)(sVar1 + uVar2 * 8);
          rVar3 = std::uniform_int_distribution<long>::operator()
                            (&local_1440,
                             (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                              *)&edge_list.
                                 super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,&local_1440._M_param);
          uVar10 = rVar3 + lVar6;
          uVar9 = *(ulong *)(cg[3] + uVar10 * 8);
          local_13b8._M_x[3] = uVar11;
          local_13b8._M_x[0] = uVar2;
          local_13b8._M_x[1] = uVar9;
          local_13b8._M_x[2] = uVar10;
          if ((char)local_1444 == '\0') {
            if (local_1468.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_1468.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) goto LAB_0010547f;
            std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::_M_realloc_insert<OrderedEdge>
                      (&local_1468,
                       (iterator)
                       local_1468.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(OrderedEdge *)&local_13b8);
          }
          else {
            uVar4 = *(long *)(cg[2] + 8 + uVar9 * 8) - *(long *)(cg[2] + uVar9 * 8);
            local_13b8._M_x[3] = uVar4;
            local_13b8._M_x[0] = uVar9;
            local_13b8._M_x[1] = uVar2;
            if (((long)uVar11 <= (long)uVar4) &&
               (local_13b8._M_x[3] = uVar11, local_13b8._M_x[0] = uVar2, local_13b8._M_x[1] = uVar9,
               (long)uVar9 < (long)uVar2 && uVar4 == uVar11)) {
              local_13b8._M_x[0] = uVar9;
              local_13b8._M_x[1] = uVar2;
            }
            if (local_1468.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_1468.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::_M_realloc_insert<OrderedEdge>
                        (&local_1468,
                         (iterator)
                         local_1468.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(OrderedEdge *)&local_13b8);
            }
            else {
LAB_0010547f:
              (local_1468.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
               super__Vector_impl_data._M_finish)->index = uVar10;
              (local_1468.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
               super__Vector_impl_data._M_finish)->degree = local_13b8._M_x[3];
              (local_1468.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
               super__Vector_impl_data._M_finish)->u = local_13b8._M_x[0];
              (local_1468.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
               super__Vector_impl_data._M_finish)->v = local_13b8._M_x[1];
              local_1468.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_1468.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          uVar5 = uVar10 + 0x3f;
          if (-1 < (long)uVar10) {
            uVar5 = uVar10;
          }
          local_13e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p
          [((long)uVar5 >> 6) + ((ulong)((uVar10 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
               local_13e0.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
               [((long)uVar5 >> 6) +
                ((ulong)((uVar10 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
               1L << ((byte)uVar10 & 0x3f);
          uVar10 = uVar2 + 0x3f;
          if (-1 < (long)uVar2) {
            uVar10 = uVar2;
          }
          local_1430.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p
          [((long)uVar10 >> 6) + ((ulong)((uVar2 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
               local_1430.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
               [((long)uVar10 >> 6) +
                ((ulong)((uVar2 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
               1L << ((byte)uVar2 & 0x3f);
          lVar8 = lVar8 + -1;
          uVar2 = uVar9;
        } while (lVar8 != 0);
      }
      lVar6 = local_13e8 + 1;
      VVar7 = local_1408;
      __return_storage_ptr__ = local_1400;
    } while (lVar6 != local_13f8);
  }
  __return_storage_ptr__->no_of_edges = local_1450;
  std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::vector
            (&__return_storage_ptr__->edge_list,&local_1468);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&__return_storage_ptr__->visited_edge_set,&local_13e0);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&__return_storage_ptr__->visited_vertex_set,&local_1430);
  __return_storage_ptr__->no_of_query = VVar7;
  if (local_1430.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_1430.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_1430.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_1430.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if (local_13e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_13e0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_13e0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_13e0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if (local_1468.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1468.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_1468.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1468.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

OrderedEdgeCollection GetEdgesByRandomWalk(CGraph *cg, Parameters params, std::mt19937 mt, bool is_degree_orered = false) {
    /**
     * Setting of various input parameters for executing the algorithm
     */
    VertexIdx n = cg->nVertices;
    EdgeIdx m = cg->nEdges;
    VertexIdx seed_count = params.seed_count; // We are working with only one seed vertex for this project
    EdgeIdx walk_length = params.walk_length;

    /**
     * Data structures for book-keeping and storing the edges found by the random walk
     */
    std::vector<OrderedEdge> edge_list;
    std::vector<bool > visited_edge_set(m,false);
    std::vector<bool > visited_vertex_set(n,false);
    VertexIdx no_of_query = 0;  // Counts the number of query made by the algorithm

    /**
     * Local variables
     */
    VertexIdx parent, child,deg_of_parent, deg_of_child;

    for (VertexIdx sC = 0; sC < seed_count; sC++) {

         VertexIdx seed = params.seed_vertices[sC]; // Random seed vertex is already in the params structure.
            parent = seed;
            deg_of_parent = cg->degree(parent); // degree of parent vertex
            if (deg_of_parent == 0)  // If we are stuck with an isolate vertex, we change the seed
                parent = AlternateSeed(cg,mt);

            for (EdgeIdx wL = 0; wL < walk_length; wL++) { // Perform a random walk of length walk_length from the seed vertex and collect the edges
                deg_of_parent = cg->degree(parent); // degree of parent vertex
                std::uniform_int_distribution<VertexIdx> dist_parent_nbor(0, deg_of_parent - 1);
                EdgeIdx random_nbor_edge = cg->offsets[parent] + dist_parent_nbor(mt); // TODO: check randomness. same seeding ok?
                no_of_query++; // One query to the uniform random neighbor oracle
                child = cg->nbors[random_nbor_edge]; // child is the next vertex on the random walk
                deg_of_child = cg->degree(child); //degree of child vertex

                /**
                 * Update the edge collection data structure with relevant information about the edge
                 */
                if (is_degree_orered) {
                    VertexIdx u, v, low_deg;
                    if (deg_of_child < deg_of_parent || (deg_of_child == deg_of_parent && child < parent)) {
                        u = child;
                        v = parent;
                        low_deg = deg_of_child;
                    } else {
                        u = parent;
                        v = child;
                        low_deg = deg_of_parent;
                    }
                    edge_list.push_back(OrderedEdge{u, v, random_nbor_edge, low_deg});
                }
                else {
                    edge_list.push_back(OrderedEdge{parent, child, random_nbor_edge, deg_of_parent});
                }

                /**
                 * Update the book-keeping data structure with the visited edge and vertices
                 */
                visited_edge_set[random_nbor_edge] = true;
                visited_vertex_set[parent] = true;
                parent = child; // The random walk proceeds with the vertex child
            }
        }

    OrderedEdgeCollection returnEdgeCollection = {walk_length, edge_list, visited_edge_set, visited_vertex_set,no_of_query};
    return returnEdgeCollection;
}